

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric.cpp
# Opt level: O2

Reals __thiscall Omega_h::delinearize_metrics_dim<3>(Omega_h *this,Reals *lms)

{
  Alloc *pAVar1;
  int n;
  void *extraout_RDX;
  size_t sVar2;
  Reals RVar3;
  allocator local_59;
  type f;
  Write<double> out;
  Write<signed_char> local_28;
  
  pAVar1 = (lms->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    sVar2 = pAVar1->size;
  }
  else {
    sVar2 = (ulong)pAVar1 >> 3;
  }
  n = divide_no_remainder<int>((int)(sVar2 >> 3),6);
  std::__cxx11::string::string((string *)&f,"",&local_59);
  Write<double>::Write(&out,n * 6,(string *)&f);
  std::__cxx11::string::~string((string *)&f);
  Write<double>::Write(&f.out,&out);
  Write<double>::Write(&f.lms.write_,&lms->write_);
  parallel_for<Omega_h::delinearize_metrics_dim<3>(Omega_h::Read<double>)::_lambda(int)_1_>
            (n,&f,"delinearize_metrics");
  Write<double>::Write(&local_28,(Write<signed_char> *)&out);
  Read<double>::Read((Read<signed_char> *)this,(Write<double> *)&local_28);
  Write<double>::~Write((Write<double> *)&local_28);
  delinearize_metrics_dim<3>(Omega_h::Read<double>)::{lambda(int)#1}::~Read((_lambda_int__1_ *)&f);
  Write<double>::~Write(&out);
  RVar3.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar3.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar3.write_.shared_alloc_;
}

Assistant:

Reals delinearize_metrics_dim(Reals lms) {
  auto n = divide_no_remainder(lms.size(), symm_ncomps(dim));
  auto out = Write<Real>(n * symm_ncomps(dim));
  auto f = OMEGA_H_LAMBDA(LO i) {
    set_symm(out, i, delinearize_metric(get_symm<dim>(lms, i)));
  };
  parallel_for(n, f, "delinearize_metrics");
  return out;
}